

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

bool __thiscall absl::TimeZone::NextTransition(TimeZone *this,Time t,CivilTransition *trans)

{
  bool bVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  civil_transition local_30;
  HiRep local_10;
  
  local_10 = t.rep_.rep_hi_;
  local_30.from.f_.y = 0x7b2;
  local_30.from.f_.m = '\x01';
  local_30.from.f_.d = '\x01';
  local_30.from.f_.hh = '\0';
  local_30.from.f_.mm = '\0';
  local_30.from.f_._12_4_ = local_30.from.f_._12_4_ & 0xffffff00;
  local_30.to.f_.y = 0x7b2;
  local_30.to.f_.m = '\x01';
  local_30.to.f_.d = '\x01';
  local_30.to.f_.hh = '\0';
  local_30.to.f_.mm = '\0';
  local_30.to.f_._12_4_ = local_30.to.f_._12_4_ & 0xffffff00;
  bVar1 = time_internal::cctz::time_zone::next_transition
                    ((time_zone *)this,(time_point<seconds> *)&local_10,&local_30);
  if (bVar1) {
    (trans->from).f_.y = local_30.from.f_.y;
    (trans->from).f_.m = local_30.from.f_.m;
    (trans->from).f_.d = local_30.from.f_.d;
    (trans->from).f_.hh = local_30.from.f_.hh;
    (trans->from).f_.mm = local_30.from.f_.mm;
    (trans->from).f_.ss = local_30.from.f_.ss;
    (trans->to).f_.y = local_30.to.f_.y;
    (trans->to).f_.m = local_30.to.f_.m;
    (trans->to).f_.d = local_30.to.f_.d;
    (trans->to).f_.hh = local_30.to.f_.hh;
    (trans->to).f_.mm = local_30.to.f_.mm;
    (trans->to).f_.ss = local_30.to.f_.ss;
  }
  return bVar1;
}

Assistant:

bool TimeZone::NextTransition(Time t, CivilTransition* trans) const {
  return FindTransition(cz_, &cctz::time_zone::next_transition, t, trans);
}